

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_correlated_expressions.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::HasCorrelatedExpressions::VisitReplace
          (HasCorrelatedExpressions *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  long *plVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  Binder *pBVar5;
  const_reference pvVar6;
  __normal_iterator<duckdb::CorrelatedColumnInfo_*,_std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>_>
  _Var7;
  idx_t i;
  ulong __n;
  shared_ptr<duckdb::Binder,_true> *this_00;
  
  bVar4 = BoundSubqueryExpression::IsCorrelated((BoundSubqueryExpression *)expr_ptr);
  if (bVar4) {
    this_00 = (shared_ptr<duckdb::Binder,_true> *)(expr_ptr + 0xb);
    __n = 0;
    do {
      plVar1 = (long *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
      if ((ulong)((plVar1[1] - *plVar1) / 0x50) <= __n) goto LAB_01304428;
      pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      pCVar2 = (pBVar5->correlated_columns).
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               .
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      pCVar3 = (pBVar5->correlated_columns).
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               .
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar6 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>
                         ((vector<duckdb::CorrelatedColumnInfo,_true> *)
                          (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p,__n);
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<duckdb::CorrelatedColumnInfo*,std::vector<duckdb::CorrelatedColumnInfo,std::allocator<duckdb::CorrelatedColumnInfo>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::CorrelatedColumnInfo_const>>
                        (pCVar2,pCVar3,pvVar6);
      pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      __n = __n + 1;
    } while (_Var7._M_current ==
             (pBVar5->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    (expr->super_Expression).super_BaseExpression.type = 1;
  }
LAB_01304428:
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> HasCorrelatedExpressions::VisitReplace(BoundSubqueryExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	if (!expr.IsCorrelated()) {
		return nullptr;
	}
	// check if the subquery contains any of the correlated expressions that we are concerned about in this node
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		if (std::find(expr.binder->correlated_columns.begin(), expr.binder->correlated_columns.end(),
		              correlated_columns[i]) != expr.binder->correlated_columns.end()) {
			has_correlated_expressions = true;
			break;
		}
	}
	return nullptr;
}